

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::StringStreamToString(stringstream *ss)

{
  String *this;
  long lVar1;
  size_t extraout_RDX;
  char *in_RDI;
  String SVar2;
  char *ch;
  stringstream helper;
  char *end;
  char *start;
  string *str;
  string *a_c_str;
  string local_208 [32];
  String *local_1e8;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  String *local_48;
  String *local_40;
  string local_38 [32];
  string *local_18;
  
  a_c_str = local_38;
  std::__cxx11::stringstream::str();
  local_18 = a_c_str;
  this = (String *)std::__cxx11::string::c_str();
  local_40 = this;
  lVar1 = std::__cxx11::string::length();
  local_48 = (String *)((long)&this->c_str_ + lVar1);
  std::__cxx11::stringstream::stringstream(local_1d0);
  for (local_1e8 = local_40; local_1e8 != local_48;
      local_1e8 = (String *)((long)&local_1e8->c_str_ + 1)) {
    if (*(char *)&local_1e8->c_str_ == '\0') {
      std::operator<<(local_1c0,"\\0");
    }
    else {
      std::ostream::put((char)local_1c0);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  String::String(this,(char *)a_c_str);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::~string(local_38);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = in_RDI;
  return SVar2;
}

Assistant:

String StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  // We need to use a helper stringstream to do this transformation
  // because String doesn't support push_back().
  ::std::stringstream helper;
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      helper << "\\0";  // Replaces NUL with "\\0";
    } else {
      helper.put(*ch);
    }
  }

  return String(helper.str().c_str());
}